

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddSymm.c
# Opt level: O2

DdNode * extraBddReduceVarSet(DdManager *dd,DdNode *bVars,DdNode *bF)

{
  int *piVar1;
  int iVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  int iVar5;
  DdNode *bF_00;
  DdNode *pDVar6;
  ulong local_38;
  
  pDVar6 = (DdNode *)((ulong)bF & 0xfffffffffffffffe);
  if (pDVar6->index == 0x7fffffff) {
    return bVars;
  }
  if (dd->one == bVars) {
    return bVars;
  }
  pDVar3 = cuddCacheLookup2(dd,extraBddReduceVarSet,bVars,bF);
  if (pDVar3 != (DdNode *)0x0) {
    return pDVar3;
  }
  iVar2 = dd->perm[pDVar6->index];
  for (pDVar3 = bVars; (ulong)pDVar3->index != 0x7fffffff; pDVar3 = (pDVar3->type).kids.T) {
    iVar5 = dd->perm[pDVar3->index];
    if (iVar2 <= iVar5) goto LAB_0067f668;
  }
  iVar5 = 0x7fffffff;
LAB_0067f668:
  pDVar4 = pDVar3;
  if (iVar2 == iVar5) {
    pDVar4 = (pDVar3->type).kids.T;
  }
  bF_00 = (pDVar6->type).kids.E;
  if (pDVar6 == bF) {
    pDVar6 = (pDVar6->type).kids.T;
  }
  else {
    bF_00 = (DdNode *)((ulong)bF_00 ^ 1);
    pDVar6 = (DdNode *)((ulong)(pDVar6->type).kids.T ^ 1);
  }
  pDVar4 = extraBddReduceVarSet(dd,pDVar4,bF_00);
  if (pDVar4 != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar6 = extraBddReduceVarSet(dd,pDVar4,pDVar6);
    if (pDVar6 != (DdNode *)0x0) {
      local_38 = (ulong)pDVar6 & 0xfffffffffffffffe;
      *(int *)(local_38 + 4) = *(int *)(local_38 + 4) + 1;
      Cudd_RecursiveDeref(dd,pDVar4);
      pDVar4 = pDVar6;
      if (pDVar3 == bVars) {
LAB_0067f735:
        *(int *)(local_38 + 4) = *(int *)(local_38 + 4) + -1;
        cuddCacheInsert2(dd,extraBddReduceVarSet,bVars,bF,pDVar4);
        return pDVar4;
      }
      pDVar3 = cuddBddExistAbstractRecur(dd,bVars,pDVar3);
      if (pDVar3 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar4 = cuddBddAndRecur(dd,pDVar6,pDVar3);
        if (pDVar4 != (DdNode *)0x0) {
          local_38 = (ulong)pDVar4 & 0xfffffffffffffffe;
          *(int *)(local_38 + 4) = *(int *)(local_38 + 4) + 1;
          Cudd_RecursiveDeref(dd,pDVar6);
          Cudd_RecursiveDeref(dd,pDVar3);
          goto LAB_0067f735;
        }
        Cudd_RecursiveDeref(dd,pDVar6);
        pDVar4 = pDVar3;
      }
    }
    Cudd_RecursiveDeref(dd,pDVar4);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraBddReduceVarSet( 
  DdManager * dd,    /* the DD manager */
  DdNode * bVars,    /* the set of variables to be reduced */
  DdNode * bF)       /* the function whose support is used for reduction */
{
    DdNode * bRes;
    DdNode * bFR = Cudd_Regular(bF);

    if ( cuddIsConstant(bFR) || bVars == b1 )
        return bVars;

    if ( (bRes = cuddCacheLookup2(dd, extraBddReduceVarSet, bVars, bF)) )
        return bRes;
    else
    {
        DdNode * bF0, * bF1;             
        DdNode * bVarsThis, * bVarsLower, * bTemp;
        int LevelF;

        // if LevelF is below LevelV, scroll through the vars in bVars 
        LevelF = dd->perm[bFR->index];
        for ( bVarsThis = bVars; LevelF > cuddI(dd,bVarsThis->index); bVarsThis = cuddT(bVarsThis) );
        // scroll also through the current var, because it should be not be added
        if ( LevelF == cuddI(dd,bVarsThis->index) )
            bVarsLower = cuddT(bVarsThis);
        else
            bVarsLower = bVarsThis;

        // cofactor the function
        if ( bFR != bF ) // bFunc is complemented 
        {
            bF0 = Cudd_Not( cuddE(bFR) );
            bF1 = Cudd_Not( cuddT(bFR) );
        }
        else
        {
            bF0 = cuddE(bFR);
            bF1 = cuddT(bFR);
        }

        // solve subproblems
        bRes = extraBddReduceVarSet( dd, bVarsLower, bF0 );
        if ( bRes == NULL ) 
            return NULL;
        cuddRef( bRes );

        bRes = extraBddReduceVarSet( dd, bTemp = bRes, bF1 );
        if ( bRes == NULL ) 
        {
            Cudd_RecursiveDeref( dd, bTemp );
            return NULL;
        }
        cuddRef( bRes );
        Cudd_RecursiveDeref( dd, bTemp );

        // the current var should not be added
        // add the skipped vars
        if ( bVarsThis != bVars )
        {
            DdNode * bVarsExtra;

            // extract the skipped variables
            bVarsExtra = cuddBddExistAbstractRecur( dd, bVars, bVarsThis );
            if ( bVarsExtra == NULL )
            {
                Cudd_RecursiveDeref( dd, bRes );
                return NULL;
            }
            cuddRef( bVarsExtra );

            // add these variables
            bRes = cuddBddAndRecur( dd, bTemp = bRes, bVarsExtra );
            if ( bRes == NULL ) 
            {
                Cudd_RecursiveDeref( dd, bTemp );
                Cudd_RecursiveDeref( dd, bVarsExtra );
                return NULL;
            }
            cuddRef( bRes );
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bVarsExtra );
        }
        cuddDeref( bRes );

        cuddCacheInsert2( dd, extraBddReduceVarSet, bVars, bF, bRes );
        return bRes;
    }
}